

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  DescriptorDatabase *pDVar1;
  uint uVar2;
  Tables *pTVar3;
  size_type sVar4;
  string *psVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  FieldDescriptor *pFVar9;
  _Insert_Return_Type local_70;
  int local_58;
  int local_54;
  int number;
  int i;
  vector<int,_std::allocator<int>_> numbers;
  MutexLockMaybe local_28;
  MutexLockMaybe lock;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *out_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  lock.mu_ = (Mutex *)out;
  out_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)extendee;
  extendee_local = (Descriptor *)this;
  internal::MutexLockMaybe::MutexLockMaybe(&local_28,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                       (&this->tables_);
    sVar4 = std::tr1::
            _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
            ::count((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                     *)&pTVar3->extensions_loaded_from_db_,(key_type *)&out_local);
    if (sVar4 == 0) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&number);
      pDVar1 = this->fallback_database_;
      psVar5 = Descriptor::full_name_abi_cxx11_((Descriptor *)out_local);
      uVar2 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,psVar5,&number);
      if ((uVar2 & 1) != 0) {
        for (local_54 = 0; uVar6 = (ulong)local_54,
            sVar7 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)&number), uVar6 < sVar7;
            local_54 = local_54 + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&number,(long)local_54);
          local_58 = *pvVar8;
          pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (&this->tables_);
          pFVar9 = Tables::FindExtension(pTVar3,(Descriptor *)out_local,local_58);
          if (pFVar9 == (FieldDescriptor *)0x0) {
            TryFindExtensionInFallbackDatabase(this,(Descriptor *)out_local,local_58);
          }
        }
        pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&this->tables_);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::insert(&local_70,
                 (_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                  *)&pTVar3->extensions_loaded_from_db_,(value_type *)&out_local);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&number);
    }
  }
  pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  Tables::FindAllExtensions
            (pTVar3,(Descriptor *)out_local,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)lock.mu_);
  if (this->underlay_ != (DescriptorPool *)0x0) {
    FindAllExtensions(this->underlay_,(Descriptor *)out_local,
                      (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)lock.mu_);
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_28);
  return;
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee, vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != NULL &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int i = 0; i < numbers.size(); ++i) {
        int number = numbers[i];
        if (tables_->FindExtension(extendee, number) == NULL) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != NULL) {
    underlay_->FindAllExtensions(extendee, out);
  }
}